

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

void getSystemContentScale(float *xscale,float *yscale)

{
  int iVar1;
  long lVar2;
  double dVar3;
  char *local_48;
  char *type;
  XrmValue value;
  XrmDatabase db;
  char *rms;
  float ydpi;
  float xdpi;
  float *yscale_local;
  float *xscale_local;
  
  rms._4_4_ = ((float)*(int *)(*(long *)(_glfw.x11.display + 0xe8) + (long)_glfw.x11.screen * 0x80 +
                              0x18) * 25.4) /
              (float)*(int *)(*(long *)(_glfw.x11.display + 0xe8) + (long)_glfw.x11.screen * 0x80 +
                             0x20);
  rms._0_4_ = ((float)*(int *)(*(long *)(_glfw.x11.display + 0xe8) + (long)_glfw.x11.screen * 0x80 +
                              0x1c) * 25.4) /
              (float)*(int *)(*(long *)(_glfw.x11.display + 0xe8) + (long)_glfw.x11.screen * 0x80 +
                             0x24);
  lVar2 = XResourceManagerString(_glfw.x11.display);
  if ((lVar2 != 0) &&
     (value.addr = (XPointer)XrmGetStringDatabase(lVar2), value.addr != (XPointer)0x0)) {
    local_48 = (char *)0x0;
    iVar1 = XrmGetResource(value.addr,"Xft.dpi","Xft.Dpi",&local_48,&type);
    if ((iVar1 != 0) &&
       ((local_48 != (char *)0x0 && (iVar1 = strcmp(local_48,"String"), iVar1 == 0)))) {
      dVar3 = atof((char *)value._0_8_);
      rms._0_4_ = (float)dVar3;
      rms._4_4_ = rms._0_4_;
    }
    XrmDestroyDatabase(value.addr);
  }
  *xscale = rms._4_4_ / 96.0;
  *yscale = rms._0_4_ / 96.0;
  return;
}

Assistant:

static void getSystemContentScale(float* xscale, float* yscale)
{
    // NOTE: Default to the display-wide DPI as we don't currently have a policy
    //       for which monitor a window is considered to be on
    float xdpi = DisplayWidth(_glfw.x11.display, _glfw.x11.screen) *
        25.4f / DisplayWidthMM(_glfw.x11.display, _glfw.x11.screen);
    float ydpi = DisplayHeight(_glfw.x11.display, _glfw.x11.screen) *
        25.4f / DisplayHeightMM(_glfw.x11.display, _glfw.x11.screen);

    // NOTE: Basing the scale on Xft.dpi where available should provide the most
    //       consistent user experience (matches Qt, Gtk, etc), although not
    //       always the most accurate one
    char* rms = XResourceManagerString(_glfw.x11.display);
    if (rms)
    {
        XrmDatabase db = XrmGetStringDatabase(rms);
        if (db)
        {
            XrmValue value;
            char* type = NULL;

            if (XrmGetResource(db, "Xft.dpi", "Xft.Dpi", &type, &value))
            {
                if (type && strcmp(type, "String") == 0)
                    xdpi = ydpi = atof(value.addr);
            }

            XrmDestroyDatabase(db);
        }
    }

    *xscale = xdpi / 96.f;
    *yscale = ydpi / 96.f;
}